

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QPixmapIconEngineEntry>::copyAppend
          (QGenericArrayOps<QPixmapIconEngineEntry> *this,QPixmapIconEngineEntry *b,
          QPixmapIconEngineEntry *e)

{
  QPixmapIconEngineEntry *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QPixmapIconEngineEntry *in_RDI;
  QPixmapIconEngineEntry *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QPixmapIconEngineEntry>::begin
                        ((QArrayDataPointer<QPixmapIconEngineEntry> *)0x293227);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QPixmapIconEngineEntry::QPixmapIconEngineEntry(this_00,in_RDI);
      local_10 = local_10 + 0x40;
      (in_RDI->pixmap).data.d.ptr =
           (QPlatformPixmap *)((long)&((in_RDI->pixmap).data.d.ptr)->_vptr_QPlatformPixmap + 1);
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }